

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall Imf_2_5::DwaCompressor::initializeBuffers(DwaCompressor *this,size_t *outBufferSize)

{
  CompressorScheme CVar1;
  pointer pCVar2;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  Zip *this_00;
  char *pcVar10;
  NoImplExc *this_01;
  long lVar11;
  size_t maxRawSize;
  int iVar12;
  int i_1;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int local_9c;
  int local_8c [3];
  ulong local_80;
  int local_78;
  int local_74;
  size_t *local_70;
  long local_68;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  local_60;
  
  local_70 = outBufferSize;
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
              *)&this->_channels);
  classifyChannels(this,(ChannelList *)&local_60,&this->_channelData,&this->_cscSets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::~_Rb_tree(&local_60);
  iVar3 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
  fVar16 = ceilf((float)iVar3 * 0.125);
  fVar17 = ceilf((float)((this->_max[0] - this->_min[0]) + 1) * 0.125);
  iVar13 = (int)fVar17 * (int)fVar16 * 0x7e;
  iVar3 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
  fVar18 = ceilf((float)iVar3 * 0.125);
  fVar19 = ceilf((float)((this->_max[0] - this->_min[0]) + 1) * 0.125);
  local_74 = (int)fVar19 * (int)fVar18 * 2;
  iVar12 = (int)fVar17 * (int)fVar16 * 0xfc + 0x10000;
  local_68 = (long)iVar13;
  local_9c = 0;
  iVar6 = 0;
  iVar3 = 0;
  local_80 = 0;
  uVar14 = 0;
  local_78 = iVar13;
  while( true ) {
    uVar15 = (ulong)uVar14;
    pCVar2 = (this->_channelData).
             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->_channelData).
                  super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2;
    lVar11 = lVar8 % 0x98;
    if ((ulong)(lVar8 / 0x98) <= uVar15) break;
    CVar1 = pCVar2[uVar15].compression;
    if (CVar1 == UNKNOWN) {
      iVar4 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
      iVar13 = this->_max[0];
      iVar7 = this->_min[0];
      iVar5 = pixelTypeSize((this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].type);
      iVar6 = iVar6 + iVar5 * ((iVar13 - iVar7) + 1) * iVar4;
    }
    else if (CVar1 == RLE) {
      iVar4 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
      iVar13 = this->_max[0];
      iVar7 = this->_min[0];
      iVar5 = pixelTypeSize((this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].type);
      iVar3 = iVar3 + iVar5 * ((iVar13 - iVar7) + 1) * iVar4 * 2;
    }
    else {
      if (CVar1 != LOSSY_DCT) goto LAB_003e61f6;
      iVar13 = compressBound(local_68,0x98,lVar11);
      if (iVar13 < iVar12) {
        iVar13 = iVar12;
      }
      local_80 = (ulong)(uint)(iVar13 + (int)local_80);
      local_9c = local_9c + 1;
    }
    uVar14 = uVar14 + 1;
  }
  uVar15 = (ulong)iVar3;
  iVar3 = compressBound(uVar15,0x98,lVar11);
  iVar6 = compressBound((long)iVar6);
  maxRawSize = (size_t)(local_74 * local_9c);
  if (this->_zip == (Zip *)0x0) {
    this_00 = (Zip *)operator_new(0x10);
    Zip::Zip(this_00,maxRawSize);
  }
  else {
    sVar9 = Zip::maxRawSize(this->_zip);
    this_00 = this->_zip;
    if (maxRawSize <= sVar9) goto LAB_003e5fff;
    if (this_00 != (Zip *)0x0) {
      Zip::~Zip(this_00);
    }
    operator_delete(this_00,0x10);
    this_00 = (Zip *)operator_new(0x10);
    Zip::Zip(this_00,maxRawSize);
  }
  this->_zip = this_00;
LAB_003e5fff:
  sVar9 = Zip::maxCompressedSize(this_00);
  *local_70 = (long)((int)sVar9 + (int)local_80 + iVar3 + iVar6 + 0x58);
  sVar9 = (size_t)(local_9c * local_78);
  if (this->_packedAcBufferSize < sVar9) {
    this->_packedAcBufferSize = sVar9;
    if (this->_packedAcBuffer != (char *)0x0) {
      operator_delete__(this->_packedAcBuffer);
      sVar9 = this->_packedAcBufferSize;
    }
    pcVar10 = (char *)operator_new__(sVar9);
    this->_packedAcBuffer = pcVar10;
  }
  if (this->_packedDcBufferSize < maxRawSize) {
    this->_packedDcBufferSize = maxRawSize;
    if (this->_packedDcBuffer != (char *)0x0) {
      operator_delete__(this->_packedDcBuffer);
      maxRawSize = this->_packedDcBufferSize;
    }
    pcVar10 = (char *)operator_new__(maxRawSize);
    this->_packedDcBuffer = pcVar10;
  }
  if (this->_rleBufferSize < uVar15) {
    this->_rleBufferSize = uVar15;
    if (this->_rleBuffer != (char *)0x0) {
      operator_delete__(this->_rleBuffer);
    }
    pcVar10 = (char *)operator_new__(uVar15);
    this->_rleBuffer = pcVar10;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    local_8c[lVar8] = 0;
  }
  uVar14 = 0;
  iVar3 = local_8c[0];
  iVar6 = local_8c[2];
  do {
    uVar15 = (ulong)uVar14;
    pCVar2 = (this->_channelData).
             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->_channelData).
                  super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2;
    if ((ulong)(lVar8 / 0x98) <= uVar15) {
      local_8c[2] = iVar6;
      local_8c[0] = iVar3;
      if (0 < iVar3) {
        local_8c[0] = compressBound(iVar3,0x98,lVar8 % 0x98);
      }
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        uVar15 = (ulong)local_8c[lVar8];
        if (this->_planarUncBufferSize[lVar8] < uVar15) {
          this->_planarUncBufferSize[lVar8] = uVar15;
          if (this->_planarUncBuffer[lVar8] != (char *)0x0) {
            operator_delete__(this->_planarUncBuffer[lVar8]);
          }
          pcVar10 = (char *)operator_new__(uVar15);
          this->_planarUncBuffer[lVar8] = pcVar10;
        }
      }
      return;
    }
    CVar1 = pCVar2[uVar15].compression;
    if (CVar1 == UNKNOWN) {
      iVar7 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
      iVar12 = this->_max[0];
      iVar13 = this->_min[0];
      iVar4 = pixelTypeSize((this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].type);
      iVar3 = iVar3 + iVar4 * ((iVar12 - iVar13) + 1) * iVar7;
    }
    else if (CVar1 != LOSSY_DCT) {
      if (CVar1 != RLE) {
LAB_003e61f6:
        this_01 = (NoImplExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::NoImplExc::NoImplExc(this_01,"Unhandled compression scheme case");
        __cxa_throw(this_01,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc);
      }
      iVar7 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
      iVar12 = this->_max[0];
      iVar13 = this->_min[0];
      iVar4 = pixelTypeSize((this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].type);
      iVar6 = iVar6 + iVar4 * ((iVar12 - iVar13) + 1) * iVar7;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void
DwaCompressor::initializeBuffers (size_t &outBufferSize)
{
    classifyChannels (_channels, _channelData, _cscSets);

    //
    // _outBuffer needs to be big enough to hold all our 
    // compressed data - which could vary depending on what sort
    // of channels we have. 
    //

    int maxOutBufferSize  = 0;
    int numLossyDctChans  = 0;
    int unknownBufferSize = 0;
    int rleBufferSize     = 0;

    int maxLossyDctAcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            63 * sizeof (unsigned short);

    int maxLossyDctDcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            sizeof (unsigned short);

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:

            //
            // This is the size of the number of packed
            // components, plus the requirements for
            // maximum Huffman encoding size (for STATIC_HUFFMAN)
            // or for zlib compression (for DEFLATE)
            //

            maxOutBufferSize += std::max(
                            (int)(2 * maxLossyDctAcSize + 65536),
                            (int)compressBound (maxLossyDctAcSize) );
            numLossyDctChans++;
            break;

          case RLE:
            {
                //
                // RLE, if gone horribly wrong, could double the size
                // of the source data.
                //

                int rleAmount = 2 * numScanLines() * (_max[0] - _min[0] + 1) *
                                OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);

                rleBufferSize += rleAmount;
            }
            break;


          case UNKNOWN:

            unknownBufferSize += numScanLines() * (_max[0] - _min[0] + 1) *
                                 OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // Also, since the results of the RLE are packed into 
    // the output buffer, we need the extra room there. But
    // we're going to zlib compress() the data we pack, 
    // which could take slightly more space
    //

    maxOutBufferSize += (int)compressBound ((uLongf)rleBufferSize);
    
    //
    // And the same goes for the UNKNOWN data
    //

    maxOutBufferSize += (int)compressBound ((uLongf)unknownBufferSize);

    //
    // Allocate a zip/deflate compressor big enought to hold the DC data
    // and include it's compressed results in the size requirements
    // for our output buffer
    //

    if (_zip == 0) 
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    else if (_zip->maxRawSize() < static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans))
    {
        delete _zip;
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    }


    maxOutBufferSize += _zip->maxCompressedSize();

    //
    // We also need to reserve space at the head of the buffer to 
    // write out the size of our various packed and compressed data.
    //

    maxOutBufferSize += NUM_SIZES_SINGLE * sizeof (Int64); 
                    

    //
    // Later, we're going to hijack outBuffer for the result of
    // both encoding and decoding. So it needs to be big enough
    // to hold either a buffers' worth of uncompressed or
    // compressed data
    //
    // For encoding, we'll need _outBuffer to hold maxOutBufferSize bytes,
    // but for decoding, we only need it to be maxScanLineSize*numScanLines.
    // Cache the max size for now, and alloc the buffer when we either
    // encode or decode.
    //

    outBufferSize = maxOutBufferSize;


    //
    // _packedAcBuffer holds the quantized DCT coefficients prior
    // to Huffman encoding
    //

    if (static_cast<size_t>(maxLossyDctAcSize * numLossyDctChans) > _packedAcBufferSize)
    {
        _packedAcBufferSize = maxLossyDctAcSize * numLossyDctChans;
        if (_packedAcBuffer != 0) 
            delete[] _packedAcBuffer;
        _packedAcBuffer = new char[_packedAcBufferSize];
    }

    //
    // _packedDcBuffer holds one quantized DCT coef per 8x8 block
    //

    if (static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans) > _packedDcBufferSize)
    {
        _packedDcBufferSize = maxLossyDctDcSize * numLossyDctChans;
        if (_packedDcBuffer != 0) 
            delete[] _packedDcBuffer;
        _packedDcBuffer     = new char[_packedDcBufferSize];
    }

    if (static_cast<size_t>(rleBufferSize) > _rleBufferSize) 
    {
        _rleBufferSize = rleBufferSize;
        if (_rleBuffer != 0) 
            delete[] _rleBuffer;
        _rleBuffer = new char[rleBufferSize];
    }

    // 
    // The planar uncompressed buffer will hold float data for LOSSY_DCT
    // compressed values, and whatever the native type is for other
    // channels. We're going to use this to hold data in a planar
    // format, as opposed to the native interleaved format we take
    // into compress() and give back from uncompress().
    //
    // This also makes it easier to compress the UNKNOWN and RLE data
    // all in one swoop (for each compression scheme).
    //

    int planarUncBufferSize[NUM_COMPRESSOR_SCHEMES];
    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
        planarUncBufferSize[i] = 0;

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:
            break;

          case RLE:
            planarUncBufferSize[RLE] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          case UNKNOWN: 
            planarUncBufferSize[UNKNOWN] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:
            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // UNKNOWN data is going to be zlib compressed, which needs 
    // a little extra headroom
    //

    if (planarUncBufferSize[UNKNOWN] > 0)
    {
        planarUncBufferSize[UNKNOWN] = 
            compressBound ((uLongf)planarUncBufferSize[UNKNOWN]);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (static_cast<size_t>(planarUncBufferSize[i]) > _planarUncBufferSize[i]) 
        {
            _planarUncBufferSize[i] = planarUncBufferSize[i];
            if (_planarUncBuffer[i] != 0) 
                delete[] _planarUncBuffer[i];
            _planarUncBuffer[i] = new char[planarUncBufferSize[i]];
        }
    }
}